

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

void __thiscall ImGuizmo::matrix_t::RotationAxis(matrix_t *this,vec_t *axis,float angle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar8 = axis->x;
  uVar1 = axis->y;
  uVar2 = axis->z;
  fVar10 = (float)uVar2 * (float)uVar2 + fVar8 * fVar8 + (float)uVar1 * (float)uVar1;
  if (1.1920929e-07 <= fVar10) {
    fVar6 = 1.0 / SQRT(fVar10);
    fVar8 = fVar8 * fVar6;
    fVar3 = sinf(angle);
    fVar4 = cosf(angle);
    fVar13 = 1.0 - fVar4;
    fVar11 = fVar6 * (float)uVar1;
    fVar6 = fVar6 * (float)uVar2;
    fVar10 = fVar4 + fVar13 * fVar11 * fVar11;
    fVar5 = fVar4 + fVar13 * fVar6 * fVar6;
    fVar9 = fVar8 * fVar11 * fVar13;
    fVar7 = fVar11 * fVar6 * fVar13;
    fVar12 = fVar8 * fVar6 * fVar13;
    (this->field_0).m[0][0] = fVar8 * fVar8 * fVar13 + fVar4;
    (this->field_0).m[0][1] = fVar6 * fVar3 + fVar9;
    (this->field_0).m[0][2] = fVar12 - fVar11 * fVar3;
    (this->field_0).m[0][3] = 0.0;
    (this->field_0).m[1][0] = fVar9 - fVar6 * fVar3;
    (this->field_0).m[1][2] = fVar8 * fVar3 + fVar7;
    (this->field_0).m[1][3] = 0.0;
    (this->field_0).m[2][0] = fVar11 * fVar3 + fVar12;
    (this->field_0).m[2][1] = fVar7 - fVar8 * fVar3;
    *(undefined8 *)((long)&this->field_0 + 0x2c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x34) = 0;
  }
  else {
    (this->field_0).m[0][0] = 1.0;
    *(undefined8 *)((long)&this->field_0 + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0xc) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x20) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x2c) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x34) = 0;
    fVar10 = 1.0;
    fVar5 = 1.0;
  }
  (this->field_0).m[1][1] = fVar10;
  (this->field_0).m[2][2] = fVar5;
  (this->field_0).m[3][3] = 1.0;
  return;
}

Assistant:

void matrix_t::RotationAxis(const vec_t & axis, float angle)
   {
      float length2 = axis.LengthSq();
      if (length2 < FLT_EPSILON)
      {
         SetToIdentity();
         return;
      }

      vec_t n = axis * (1.f / sqrtf(length2));
      float s = sinf(angle);
      float c = cosf(angle);
      float k = 1.f - c;

      float xx = n.x * n.x * k + c;
      float yy = n.y * n.y * k + c;
      float zz = n.z * n.z * k + c;
      float xy = n.x * n.y * k;
      float yz = n.y * n.z * k;
      float zx = n.z * n.x * k;
      float xs = n.x * s;
      float ys = n.y * s;
      float zs = n.z * s;

      m[0][0] = xx;
      m[0][1] = xy + zs;
      m[0][2] = zx - ys;
      m[0][3] = 0.f;
      m[1][0] = xy - zs;
      m[1][1] = yy;
      m[1][2] = yz + xs;
      m[1][3] = 0.f;
      m[2][0] = zx + ys;
      m[2][1] = yz - xs;
      m[2][2] = zz;
      m[2][3] = 0.f;
      m[3][0] = 0.f;
      m[3][1] = 0.f;
      m[3][2] = 0.f;
      m[3][3] = 1.f;
   }